

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SweepGradientShadingPatternWritingTask.cpp
# Opt level: O0

void __thiscall
SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask
          (SweepGradientShadingPatternWritingTask *this,double inCX,double inCY,
          double inStartAngleRad,double inEndAngleRad,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  FT_PaintExtend inGradientExtend_local;
  InterpretedGradientStopList *inColorLine_local;
  double inEndAngleRad_local;
  double inStartAngleRad_local;
  double inCY_local;
  double inCX_local;
  SweepGradientShadingPatternWritingTask *this_local;
  
  IObjectEndWritingTask::IObjectEndWritingTask(&this->super_IObjectEndWritingTask);
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__SweepGradientShadingPatternWritingTask_0054f518;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (&this->mColorLine);
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->cX = inCX;
  this->cY = inCY;
  this->startAngleRad = inStartAngleRad;
  this->endAngleRad = inEndAngleRad;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::operator=
            (&this->mColorLine,inColorLine);
  this->mGradientExtend = inGradientExtend;
  (this->mBounds).LowerLeftX = inBounds->LowerLeftX;
  (this->mBounds).LowerLeftY = inBounds->LowerLeftY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = inBounds->UpperRightY;
  memcpy(&this->mMatrix,inMatrix,0x30);
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

SweepGradientShadingPatternWritingTask::SweepGradientShadingPatternWritingTask(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
    cX = inCX;
    cY = inCY;
    startAngleRad = inStartAngleRad;
    endAngleRad = inEndAngleRad;
    mColorLine = inColorLine;
    mGradientExtend = inGradientExtend;
    mBounds = inBounds;
    mMatrix = inMatrix;
    mPatternObjectId = inPatternObjectId;
}